

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [32];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar21;
  int iVar22;
  AABBNodeMB4D *node1;
  ulong uVar23;
  byte bVar24;
  byte bVar25;
  ulong uVar26;
  ulong unaff_RBP;
  size_t mask;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar27;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 in_ZMM15 [64];
  undefined8 local_26a8;
  undefined8 uStack_26a0;
  StackItemT<embree::NodeRefPtr<8>_> *local_2698;
  ulong local_2690;
  ulong local_2688;
  ulong local_2680;
  ulong local_2678;
  ulong local_2670;
  long local_2668;
  long local_2660;
  RTCFilterFunctionNArguments args;
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  undefined1 local_24d8 [16];
  float local_24c8 [4];
  undefined1 local_24b8 [16];
  RTCHitN local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined4 local_2468;
  undefined4 uStack_2464;
  undefined4 uStack_2460;
  undefined4 uStack_245c;
  undefined1 local_2458 [16];
  undefined1 local_2448 [16];
  uint local_2438;
  uint uStack_2434;
  uint uStack_2430;
  uint uStack_242c;
  uint uStack_2428;
  uint uStack_2424;
  uint uStack_2420;
  uint uStack_241c;
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  pSVar27 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar59 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar61 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar62 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar2 * 0.99999964)));
  auVar63 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar3 * 0.99999964)));
  auVar64 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 0.99999964)));
  fVar2 = fVar2 * 1.0000004;
  local_23b8._4_4_ = fVar2;
  local_23b8._0_4_ = fVar2;
  local_23b8._8_4_ = fVar2;
  local_23b8._12_4_ = fVar2;
  local_23b8._16_4_ = fVar2;
  local_23b8._20_4_ = fVar2;
  local_23b8._24_4_ = fVar2;
  local_23b8._28_4_ = fVar2;
  auVar80 = ZEXT3264(local_23b8);
  fVar3 = fVar3 * 1.0000004;
  local_23d8._4_4_ = fVar3;
  local_23d8._0_4_ = fVar3;
  local_23d8._8_4_ = fVar3;
  local_23d8._12_4_ = fVar3;
  local_23d8._16_4_ = fVar3;
  local_23d8._20_4_ = fVar3;
  local_23d8._24_4_ = fVar3;
  local_23d8._28_4_ = fVar3;
  auVar81 = ZEXT3264(local_23d8);
  fVar4 = fVar4 * 1.0000004;
  local_23f8._4_4_ = fVar4;
  local_23f8._0_4_ = fVar4;
  local_23f8._8_4_ = fVar4;
  local_23f8._12_4_ = fVar4;
  local_23f8._16_4_ = fVar4;
  local_23f8._20_4_ = fVar4;
  local_23f8._24_4_ = fVar4;
  local_23f8._28_4_ = fVar4;
  auVar83 = ZEXT3264(local_23f8);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2678 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2680 = uVar28 ^ 0x20;
  local_2688 = uVar29 ^ 0x20;
  local_2690 = local_2678 ^ 0x20;
  iVar22 = (tray->tnear).field_0.i[k];
  local_2418._4_4_ = iVar22;
  local_2418._0_4_ = iVar22;
  local_2418._8_4_ = iVar22;
  local_2418._12_4_ = iVar22;
  local_2418._16_4_ = iVar22;
  local_2418._20_4_ = iVar22;
  local_2418._24_4_ = iVar22;
  local_2418._28_4_ = iVar22;
  auVar84 = ZEXT3264(local_2418);
  iVar22 = (tray->tfar).field_0.i[k];
  auVar74 = ZEXT3264(CONCAT428(iVar22,CONCAT424(iVar22,CONCAT420(iVar22,CONCAT416(iVar22,CONCAT412(
                                                  iVar22,CONCAT48(iVar22,CONCAT44(iVar22,iVar22)))))
                                               )));
  local_24b8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar70 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar85 = ZEXT3264(auVar70);
  auVar87 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  uVar26 = local_2678;
  uVar35 = local_2690;
  uVar30 = local_2680;
  uVar31 = local_2688;
  do {
    do {
      do {
        if (pSVar27 == stack) {
          return;
        }
        pSVar21 = pSVar27 + -1;
        pSVar27 = pSVar27 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar21->dist);
      uVar34 = (pSVar27->ptr).ptr;
      do {
        auVar70 = auVar84._0_32_;
        if ((uVar34 & 8) == 0) {
          uVar23 = uVar34 & 0xfffffffffffffff0;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar75._4_4_ = uVar5;
          auVar75._0_4_ = uVar5;
          auVar75._8_4_ = uVar5;
          auVar75._12_4_ = uVar5;
          auVar75._16_4_ = uVar5;
          auVar75._20_4_ = uVar5;
          auVar75._24_4_ = uVar5;
          auVar75._28_4_ = uVar5;
          auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x100 + uVar28),auVar75,
                                    *(undefined1 (*) [32])(uVar23 + 0x40 + uVar28));
          auVar65 = vsubps_avx512vl(ZEXT1632(auVar58),auVar59);
          auVar65 = vmulps_avx512vl(auVar62,auVar65);
          auVar65 = vmaxps_avx(auVar70,auVar65);
          auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x100 + uVar29),auVar75,
                                    *(undefined1 (*) [32])(uVar23 + 0x40 + uVar29));
          auVar66 = vsubps_avx512vl(ZEXT1632(auVar58),auVar60);
          auVar66 = vmulps_avx512vl(auVar63,auVar66);
          auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x100 + uVar26),auVar75,
                                    *(undefined1 (*) [32])(uVar23 + 0x40 + uVar26));
          auVar67 = vsubps_avx512vl(ZEXT1632(auVar58),auVar61);
          auVar67 = vmulps_avx512vl(auVar64,auVar67);
          auVar66 = vmaxps_avx(auVar66,auVar67);
          auVar65 = vmaxps_avx(auVar65,auVar66);
          in_ZMM15 = ZEXT3264(auVar65);
          auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x100 + uVar30),auVar75,
                                    *(undefined1 (*) [32])(uVar23 + 0x40 + uVar30));
          auVar66 = vsubps_avx512vl(ZEXT1632(auVar58),auVar59);
          auVar67._4_4_ = auVar80._4_4_ * auVar66._4_4_;
          auVar67._0_4_ = auVar80._0_4_ * auVar66._0_4_;
          auVar67._8_4_ = auVar80._8_4_ * auVar66._8_4_;
          auVar67._12_4_ = auVar80._12_4_ * auVar66._12_4_;
          auVar67._16_4_ = auVar80._16_4_ * auVar66._16_4_;
          auVar67._20_4_ = auVar80._20_4_ * auVar66._20_4_;
          auVar67._24_4_ = auVar80._24_4_ * auVar66._24_4_;
          auVar67._28_4_ = auVar66._28_4_;
          auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x100 + uVar31),auVar75,
                                    *(undefined1 (*) [32])(uVar23 + 0x40 + uVar31));
          auVar68 = vsubps_avx512vl(ZEXT1632(auVar58),auVar60);
          auVar66._4_4_ = auVar81._4_4_ * auVar68._4_4_;
          auVar66._0_4_ = auVar81._0_4_ * auVar68._0_4_;
          auVar66._8_4_ = auVar81._8_4_ * auVar68._8_4_;
          auVar66._12_4_ = auVar81._12_4_ * auVar68._12_4_;
          auVar66._16_4_ = auVar81._16_4_ * auVar68._16_4_;
          auVar66._20_4_ = auVar81._20_4_ * auVar68._20_4_;
          auVar66._24_4_ = auVar81._24_4_ * auVar68._24_4_;
          auVar66._28_4_ = auVar68._28_4_;
          auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x100 + uVar35),auVar75,
                                    *(undefined1 (*) [32])(uVar23 + 0x40 + uVar35));
          auVar69 = vsubps_avx512vl(ZEXT1632(auVar58),auVar61);
          auVar68._4_4_ = auVar83._4_4_ * auVar69._4_4_;
          auVar68._0_4_ = auVar83._0_4_ * auVar69._0_4_;
          auVar68._8_4_ = auVar83._8_4_ * auVar69._8_4_;
          auVar68._12_4_ = auVar83._12_4_ * auVar69._12_4_;
          auVar68._16_4_ = auVar83._16_4_ * auVar69._16_4_;
          auVar68._20_4_ = auVar83._20_4_ * auVar69._20_4_;
          auVar68._24_4_ = auVar83._24_4_ * auVar69._24_4_;
          auVar68._28_4_ = auVar69._28_4_;
          auVar66 = vminps_avx(auVar66,auVar68);
          auVar67 = vminps_avx(auVar74._0_32_,auVar67);
          auVar66 = vminps_avx(auVar67,auVar66);
          if (((uint)uVar34 & 7) == 6) {
            uVar16 = vcmpps_avx512vl(auVar65,auVar66,2);
            uVar15 = vcmpps_avx512vl(auVar75,*(undefined1 (*) [32])(uVar23 + 0x1c0),0xd);
            uVar17 = vcmpps_avx512vl(auVar75,*(undefined1 (*) [32])(uVar23 + 0x1e0),1);
            bVar25 = (byte)uVar16 & (byte)uVar15 & (byte)uVar17;
          }
          else {
            uVar16 = vcmpps_avx512vl(auVar65,auVar66,2);
            bVar25 = (byte)uVar16;
          }
          unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),(uint)bVar25);
        }
        if ((uVar34 & 8) == 0) {
          if (unaff_RBP == 0) {
            iVar22 = 4;
          }
          else {
            auVar65 = *(undefined1 (*) [32])(uVar34 & 0xfffffffffffffff0);
            auVar66 = ((undefined1 (*) [32])(uVar34 & 0xfffffffffffffff0))[1];
            auVar75 = auVar85._0_32_;
            auVar86 = auVar87._0_32_;
            auVar73 = in_ZMM15._0_32_;
            auVar67 = vpternlogd_avx512vl(auVar75,auVar73,auVar86,0xf8);
            uVar34 = unaff_RBP & 0xffffffff;
            auVar68 = vpcompressd_avx512vl(auVar67);
            bVar13 = (bool)((byte)uVar34 & 1);
            auVar69._0_4_ = (uint)bVar13 * auVar68._0_4_ | (uint)!bVar13 * auVar67._0_4_;
            bVar13 = (bool)((byte)(uVar34 >> 1) & 1);
            auVar69._4_4_ = (uint)bVar13 * auVar68._4_4_ | (uint)!bVar13 * auVar67._4_4_;
            bVar13 = (bool)((byte)(uVar34 >> 2) & 1);
            auVar69._8_4_ = (uint)bVar13 * auVar68._8_4_ | (uint)!bVar13 * auVar67._8_4_;
            bVar13 = (bool)((byte)(uVar34 >> 3) & 1);
            auVar69._12_4_ = (uint)bVar13 * auVar68._12_4_ | (uint)!bVar13 * auVar67._12_4_;
            bVar13 = (bool)((byte)(uVar34 >> 4) & 1);
            auVar69._16_4_ = (uint)bVar13 * auVar68._16_4_ | (uint)!bVar13 * auVar67._16_4_;
            bVar13 = (bool)((byte)(uVar34 >> 5) & 1);
            auVar69._20_4_ = (uint)bVar13 * auVar68._20_4_ | (uint)!bVar13 * auVar67._20_4_;
            bVar13 = (bool)((byte)(uVar34 >> 6) & 1);
            auVar69._24_4_ = (uint)bVar13 * auVar68._24_4_ | (uint)!bVar13 * auVar67._24_4_;
            bVar13 = (bool)((byte)(uVar34 >> 7) & 1);
            auVar69._28_4_ = (uint)bVar13 * auVar68._28_4_ | (uint)!bVar13 * auVar67._28_4_;
            auVar67 = vpermt2q_avx512vl(auVar65,auVar69,auVar66);
            uVar34 = auVar67._0_8_;
            iVar22 = 0;
            uVar23 = unaff_RBP - 1 & unaff_RBP;
            if (uVar23 != 0) {
              auVar67 = vpshufd_avx2(auVar69,0x55);
              vpermt2q_avx512vl(auVar65,auVar67,auVar66);
              auVar68 = vpminsd_avx2(auVar69,auVar67);
              auVar67 = vpmaxsd_avx2(auVar69,auVar67);
              uVar23 = uVar23 - 1 & uVar23;
              if (uVar23 == 0) {
                auVar70 = vpermi2q_avx512vl(auVar68,auVar65,auVar66);
                uVar34 = auVar70._0_8_;
                auVar70 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
                (pSVar27->ptr).ptr = auVar70._0_8_;
                auVar70 = vpermd_avx2(auVar67,auVar73);
                pSVar27->dist = auVar70._0_4_;
                pSVar27 = pSVar27 + 1;
              }
              else {
                auVar14 = vpshufd_avx2(auVar69,0xaa);
                vpermt2q_avx512vl(auVar65,auVar14,auVar66);
                auVar76 = vpminsd_avx2(auVar68,auVar14);
                auVar68 = vpmaxsd_avx2(auVar68,auVar14);
                auVar14 = vpminsd_avx2(auVar67,auVar68);
                auVar67 = vpmaxsd_avx2(auVar67,auVar68);
                uVar23 = uVar23 - 1 & uVar23;
                if (uVar23 == 0) {
                  auVar70 = vpermi2q_avx512vl(auVar76,auVar65,auVar66);
                  uVar34 = auVar70._0_8_;
                  auVar70 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
                  (pSVar27->ptr).ptr = auVar70._0_8_;
                  auVar70 = vpermd_avx2(auVar67,auVar73);
                  pSVar27->dist = auVar70._0_4_;
                  auVar70 = vpermt2q_avx512vl(auVar65,auVar14,auVar66);
                  pSVar27[1].ptr.ptr = auVar70._0_8_;
                  auVar70 = vpermd_avx2(auVar14,auVar73);
                  pSVar27[1].dist = auVar70._0_4_;
                  pSVar27 = pSVar27 + 2;
                }
                else {
                  auVar71 = vmovdqa64_avx512vl(auVar73);
                  auVar68 = vpshufd_avx2(auVar69,0xff);
                  vpermt2q_avx512vl(auVar65,auVar68,auVar66);
                  auVar73 = vpminsd_avx2(auVar76,auVar68);
                  auVar68 = vpmaxsd_avx2(auVar76,auVar68);
                  auVar76 = vpminsd_avx2(auVar14,auVar68);
                  auVar68 = vpmaxsd_avx2(auVar14,auVar68);
                  auVar14 = vpminsd_avx2(auVar67,auVar68);
                  auVar67 = vpmaxsd_avx2(auVar67,auVar68);
                  uVar23 = uVar23 - 1 & uVar23;
                  if (uVar23 == 0) {
                    auVar68 = vpermi2q_avx512vl(auVar73,auVar65,auVar66);
                    uVar34 = auVar68._0_8_;
                    auVar68 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
                    (pSVar27->ptr).ptr = auVar68._0_8_;
                    auVar68 = vmovdqa64_avx512vl(auVar71);
                    in_ZMM15 = ZEXT3264(auVar68);
                    auVar67 = vpermd_avx512vl(auVar67,auVar71);
                    pSVar27->dist = auVar67._0_4_;
                    auVar67 = vpermt2q_avx512vl(auVar65,auVar14,auVar66);
                    pSVar27[1].ptr.ptr = auVar67._0_8_;
                    auVar67 = vpermd_avx512vl(auVar14,auVar71);
                    pSVar27[1].dist = auVar67._0_4_;
                    auVar65 = vpermt2q_avx512vl(auVar65,auVar76,auVar66);
                    pSVar27[2].ptr.ptr = auVar65._0_8_;
                    auVar65 = vpermd_avx512vl(auVar76,auVar71);
                    pSVar27[2].dist = auVar65._0_4_;
                    pSVar27 = pSVar27 + 3;
                    auVar80 = ZEXT3264(auVar80._0_32_);
                    auVar81 = ZEXT3264(auVar81._0_32_);
                    auVar83 = ZEXT3264(auVar83._0_32_);
                    auVar84 = ZEXT3264(auVar70);
                    auVar85 = ZEXT3264(auVar75);
                    auVar87 = ZEXT3264(auVar86);
                  }
                  else {
                    auVar72 = valignd_avx512vl(auVar69,auVar69,3);
                    auVar68 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                    auVar69 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                   CONCAT48(0x80000000,
                                                                            0x8000000080000000))),
                                                auVar68,auVar73);
                    auVar68 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                    auVar69 = vpermt2d_avx512vl(auVar69,auVar68,auVar76);
                    auVar69 = vpermt2d_avx512vl(auVar69,auVar68,auVar14);
                    auVar68 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                    auVar67 = vpermt2d_avx512vl(auVar69,auVar68,auVar67);
                    auVar84 = ZEXT3264(auVar67);
                    uVar34 = uVar23;
                    do {
                      auVar68 = auVar84._0_32_;
                      auVar76._8_4_ = 1;
                      auVar76._0_8_ = 0x100000001;
                      auVar76._12_4_ = 1;
                      auVar76._16_4_ = 1;
                      auVar76._20_4_ = 1;
                      auVar76._24_4_ = 1;
                      auVar76._28_4_ = 1;
                      auVar67 = vpermd_avx2(auVar76,auVar72);
                      auVar72 = valignd_avx512vl(auVar72,auVar72,1);
                      vpermt2q_avx512vl(auVar65,auVar72,auVar66);
                      uVar34 = uVar34 - 1 & uVar34;
                      uVar16 = vpcmpd_avx512vl(auVar67,auVar68,5);
                      auVar67 = vpmaxsd_avx2(auVar67,auVar68);
                      bVar25 = (byte)uVar16 << 1;
                      auVar68 = valignd_avx512vl(auVar68,auVar68,7);
                      bVar13 = (bool)((byte)uVar16 & 1);
                      auVar73._4_4_ = (uint)bVar13 * auVar68._4_4_ | (uint)!bVar13 * auVar67._4_4_;
                      auVar73._0_4_ = auVar67._0_4_;
                      bVar13 = (bool)(bVar25 >> 2 & 1);
                      auVar73._8_4_ = (uint)bVar13 * auVar68._8_4_ | (uint)!bVar13 * auVar67._8_4_;
                      bVar13 = (bool)(bVar25 >> 3 & 1);
                      auVar73._12_4_ =
                           (uint)bVar13 * auVar68._12_4_ | (uint)!bVar13 * auVar67._12_4_;
                      bVar13 = (bool)(bVar25 >> 4 & 1);
                      auVar73._16_4_ =
                           (uint)bVar13 * auVar68._16_4_ | (uint)!bVar13 * auVar67._16_4_;
                      bVar13 = (bool)(bVar25 >> 5 & 1);
                      auVar73._20_4_ =
                           (uint)bVar13 * auVar68._20_4_ | (uint)!bVar13 * auVar67._20_4_;
                      bVar13 = (bool)(bVar25 >> 6 & 1);
                      auVar73._24_4_ =
                           (uint)bVar13 * auVar68._24_4_ | (uint)!bVar13 * auVar67._24_4_;
                      auVar73._28_4_ =
                           (uint)(bVar25 >> 7) * auVar68._28_4_ |
                           (uint)!(bool)(bVar25 >> 7) * auVar67._28_4_;
                      auVar84 = ZEXT3264(auVar73);
                    } while (uVar34 != 0);
                    lVar32 = POPCOUNT(uVar23) + 3;
                    do {
                      auVar67 = vpermi2q_avx512vl(auVar73,auVar65,auVar66);
                      (pSVar27->ptr).ptr = auVar67._0_8_;
                      auVar68 = auVar84._0_32_;
                      auVar67 = vpermd_avx512vl(auVar68,auVar71);
                      pSVar27->dist = auVar67._0_4_;
                      auVar73 = valignd_avx512vl(auVar68,auVar68,1);
                      pSVar27 = pSVar27 + 1;
                      auVar84 = ZEXT3264(auVar73);
                      lVar32 = lVar32 + -1;
                    } while (lVar32 != 0);
                    auVar65 = vpermt2q_avx512vl(auVar65,auVar73,auVar66);
                    uVar34 = auVar65._0_8_;
                    auVar80 = ZEXT3264(auVar80._0_32_);
                    auVar81 = ZEXT3264(auVar81._0_32_);
                    auVar83 = ZEXT3264(auVar83._0_32_);
                    auVar84 = ZEXT3264(auVar70);
                    auVar85 = ZEXT3264(auVar75);
                    auVar87 = ZEXT3264(auVar86);
                    auVar70 = vmovdqa64_avx512vl(auVar71);
                    in_ZMM15 = ZEXT3264(auVar70);
                  }
                }
              }
            }
          }
        }
        else {
          iVar22 = 6;
        }
      } while (iVar22 == 0);
    } while (iVar22 != 6);
    local_2398 = in_ZMM15._0_32_;
    local_2668 = (ulong)((uint)uVar34 & 0xf) - 8;
    local_2670 = unaff_RBP;
    if (local_2668 != 0) {
      uVar34 = uVar34 & 0xfffffffffffffff0;
      local_2660 = 0;
      do {
        lVar32 = local_2660 * 0x140;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar45._4_4_ = uVar5;
        auVar45._0_4_ = uVar5;
        auVar45._8_4_ = uVar5;
        auVar45._12_4_ = uVar5;
        auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0x90 + lVar32),auVar45,
                                  *(undefined1 (*) [16])(uVar34 + lVar32));
        auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xa0 + lVar32),auVar45,
                                  *(undefined1 (*) [16])(uVar34 + 0x10 + lVar32));
        auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xb0 + lVar32),auVar45,
                                  *(undefined1 (*) [16])(uVar34 + 0x20 + lVar32));
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xc0 + lVar32),auVar45,
                                  *(undefined1 (*) [16])(uVar34 + 0x30 + lVar32));
        auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xd0 + lVar32),auVar45,
                                  *(undefined1 (*) [16])(uVar34 + 0x40 + lVar32));
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xe0 + lVar32),auVar45,
                                  *(undefined1 (*) [16])(uVar34 + 0x50 + lVar32));
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xf0 + lVar32),auVar45,
                                  *(undefined1 (*) [16])(uVar34 + 0x60 + lVar32));
        auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0x100 + lVar32),auVar45,
                                  *(undefined1 (*) [16])(uVar34 + 0x70 + lVar32));
        auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0x110 + lVar32),auVar45,
                                  *(undefined1 (*) [16])(uVar34 + 0x80 + lVar32));
        uVar5 = *(undefined4 *)(ray + k * 4);
        auVar46._4_4_ = uVar5;
        auVar46._0_4_ = uVar5;
        auVar46._8_4_ = uVar5;
        auVar46._12_4_ = uVar5;
        auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
        auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar77._4_4_ = uVar5;
        auVar77._0_4_ = uVar5;
        auVar77._8_4_ = uVar5;
        auVar77._12_4_ = uVar5;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar79._4_4_ = uVar5;
        auVar79._0_4_ = uVar5;
        auVar79._8_4_ = uVar5;
        auVar79._12_4_ = uVar5;
        fVar2 = *(float *)(ray + k * 4 + 0x60);
        auVar82._4_4_ = fVar2;
        auVar82._0_4_ = fVar2;
        auVar82._8_4_ = fVar2;
        auVar82._12_4_ = fVar2;
        auVar58 = vsubps_avx(auVar58,auVar46);
        auVar38 = vsubps_avx512vl(auVar56,auVar36);
        auVar39 = vsubps_avx512vl(auVar57,auVar37);
        auVar40 = vsubps_avx512vl(auVar51,auVar46);
        auVar41 = vsubps_avx512vl(auVar41,auVar36);
        auVar42 = vsubps_avx512vl(auVar42,auVar37);
        auVar43 = vsubps_avx512vl(auVar43,auVar46);
        auVar44 = vsubps_avx512vl(auVar44,auVar36);
        auVar45 = vsubps_avx512vl(auVar45,auVar37);
        auVar36 = vsubps_avx512vl(auVar43,auVar58);
        auVar56 = vsubps_avx(auVar44,auVar38);
        auVar57 = vsubps_avx(auVar45,auVar39);
        auVar37 = vsubps_avx512vl(auVar58,auVar40);
        auVar46 = vsubps_avx512vl(auVar38,auVar41);
        auVar47 = vsubps_avx512vl(auVar39,auVar42);
        auVar48 = vsubps_avx512vl(auVar40,auVar43);
        auVar49 = vsubps_avx512vl(auVar41,auVar44);
        auVar50 = vsubps_avx512vl(auVar42,auVar45);
        auVar51 = vaddps_avx512vl(auVar43,auVar58);
        auVar78._0_4_ = auVar44._0_4_ + auVar38._0_4_;
        auVar78._4_4_ = auVar44._4_4_ + auVar38._4_4_;
        auVar78._8_4_ = auVar44._8_4_ + auVar38._8_4_;
        auVar78._12_4_ = auVar44._12_4_ + auVar38._12_4_;
        auVar52 = vaddps_avx512vl(auVar45,auVar39);
        auVar53 = vmulps_avx512vl(auVar78,auVar57);
        auVar53 = vfmsub231ps_avx512vl(auVar53,auVar56,auVar52);
        auVar52 = vmulps_avx512vl(auVar52,auVar36);
        auVar52 = vfmsub231ps_avx512vl(auVar52,auVar57,auVar51);
        auVar54._0_4_ = auVar56._0_4_ * auVar51._0_4_;
        auVar54._4_4_ = auVar56._4_4_ * auVar51._4_4_;
        auVar54._8_4_ = auVar56._8_4_ * auVar51._8_4_;
        auVar54._12_4_ = auVar56._12_4_ * auVar51._12_4_;
        auVar51 = vfmsub231ps_fma(auVar54,auVar36,auVar78);
        auVar55._0_4_ = fVar2 * auVar51._0_4_;
        auVar55._4_4_ = fVar2 * auVar51._4_4_;
        auVar55._8_4_ = fVar2 * auVar51._8_4_;
        auVar55._12_4_ = fVar2 * auVar51._12_4_;
        auVar51 = vfmadd231ps_avx512vl(auVar55,auVar79,auVar52);
        auVar52 = vfmadd231ps_avx512vl(auVar51,auVar77,auVar53);
        auVar51 = vaddps_avx512vl(auVar58,auVar40);
        auVar53 = vaddps_avx512vl(auVar38,auVar41);
        auVar54 = vaddps_avx512vl(auVar39,auVar42);
        auVar55 = vmulps_avx512vl(auVar53,auVar47);
        auVar55 = vfmsub231ps_avx512vl(auVar55,auVar46,auVar54);
        auVar54 = vmulps_avx512vl(auVar54,auVar37);
        auVar54 = vfmsub231ps_avx512vl(auVar54,auVar47,auVar51);
        auVar51 = vmulps_avx512vl(auVar51,auVar46);
        auVar51 = vfmsub231ps_avx512vl(auVar51,auVar37,auVar53);
        auVar53._0_4_ = fVar2 * auVar51._0_4_;
        auVar53._4_4_ = fVar2 * auVar51._4_4_;
        auVar53._8_4_ = fVar2 * auVar51._8_4_;
        auVar53._12_4_ = fVar2 * auVar51._12_4_;
        auVar51 = vfmadd231ps_avx512vl(auVar53,auVar79,auVar54);
        auVar53 = vfmadd231ps_avx512vl(auVar51,auVar77,auVar55);
        auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar74 = ZEXT1664(auVar54);
        auVar51 = vaddps_avx512vl(auVar40,auVar43);
        auVar41 = vaddps_avx512vl(auVar41,auVar44);
        auVar42 = vaddps_avx512vl(auVar42,auVar45);
        auVar43 = vmulps_avx512vl(auVar41,auVar50);
        auVar43 = vfmsub231ps_avx512vl(auVar43,auVar49,auVar42);
        auVar44._0_4_ = auVar42._0_4_ * auVar48._0_4_;
        auVar44._4_4_ = auVar42._4_4_ * auVar48._4_4_;
        auVar44._8_4_ = auVar42._8_4_ * auVar48._8_4_;
        auVar44._12_4_ = auVar42._12_4_ * auVar48._12_4_;
        auVar42 = vfmsub231ps_avx512vl(auVar44,auVar50,auVar51);
        auVar51 = vmulps_avx512vl(auVar51,auVar49);
        auVar51 = vfmsub231ps_avx512vl(auVar51,auVar48,auVar41);
        auVar51 = vmulps_avx512vl(auVar51,auVar82);
        auVar51 = vfmadd231ps_avx512vl(auVar51,auVar79,auVar42);
        auVar42 = vfmadd231ps_avx512vl(auVar51,auVar77,auVar43);
        auVar43._0_4_ = auVar52._0_4_ + auVar53._0_4_;
        auVar43._4_4_ = auVar52._4_4_ + auVar53._4_4_;
        auVar43._8_4_ = auVar52._8_4_ + auVar53._8_4_;
        auVar43._12_4_ = auVar52._12_4_ + auVar53._12_4_;
        auVar43 = vaddps_avx512vl(auVar42,auVar43);
        auVar51._8_4_ = 0x7fffffff;
        auVar51._0_8_ = 0x7fffffff7fffffff;
        auVar51._12_4_ = 0x7fffffff;
        auVar51 = vandps_avx512vl(auVar43,auVar51);
        auVar41._8_4_ = 0x34000000;
        auVar41._0_8_ = 0x3400000034000000;
        auVar41._12_4_ = 0x34000000;
        auVar41 = vmulps_avx512vl(auVar51,auVar41);
        auVar44 = vminps_avx512vl(auVar52,auVar53);
        auVar44 = vminps_avx512vl(auVar44,auVar42);
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar45 = vxorps_avx512vl(auVar41,auVar45);
        uVar16 = vcmpps_avx512vl(auVar44,auVar45,5);
        auVar44 = vmaxps_avx512vl(auVar52,auVar53);
        auVar42 = vmaxps_avx512vl(auVar44,auVar42);
        uVar15 = vcmpps_avx512vl(auVar42,auVar41,2);
        bVar25 = ((byte)uVar16 | (byte)uVar15) & 0xf;
        if (bVar25 != 0) {
          auVar41 = vmulps_avx512vl(auVar46,auVar57);
          auVar42 = vmulps_avx512vl(auVar36,auVar47);
          auVar44 = vmulps_avx512vl(auVar37,auVar56);
          auVar45 = vmulps_avx512vl(auVar49,auVar47);
          auVar40 = vmulps_avx512vl(auVar37,auVar50);
          auVar55 = vmulps_avx512vl(auVar48,auVar46);
          auVar56 = vfmsub213ps_avx512vl(auVar56,auVar47,auVar41);
          auVar57 = vfmsub213ps_avx512vl(auVar57,auVar37,auVar42);
          auVar36 = vfmsub213ps_avx512vl(auVar36,auVar46,auVar44);
          auVar46 = vfmsub213ps_avx512vl(auVar50,auVar46,auVar45);
          auVar47 = vfmsub213ps_avx512vl(auVar48,auVar47,auVar40);
          auVar37 = vfmsub213ps_avx512vl(auVar49,auVar37,auVar55);
          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar41 = vandps_avx512vl(auVar41,auVar48);
          auVar45 = vandps_avx512vl(auVar45,auVar48);
          uVar26 = vcmpps_avx512vl(auVar41,auVar45,1);
          auVar41 = vandps_avx512vl(auVar42,auVar48);
          auVar42 = vandps_avx512vl(auVar40,auVar48);
          uVar35 = vcmpps_avx512vl(auVar41,auVar42,1);
          auVar41 = vandps_avx512vl(auVar44,auVar48);
          auVar42 = vandps_avx512vl(auVar55,auVar48);
          uVar30 = vcmpps_avx512vl(auVar41,auVar42,1);
          bVar13 = (bool)((byte)uVar26 & 1);
          local_24e8._0_4_ = (uint)bVar13 * auVar56._0_4_ | (uint)!bVar13 * auVar46._0_4_;
          bVar13 = (bool)((byte)(uVar26 >> 1) & 1);
          local_24e8._4_4_ = (uint)bVar13 * auVar56._4_4_ | (uint)!bVar13 * auVar46._4_4_;
          bVar13 = (bool)((byte)(uVar26 >> 2) & 1);
          local_24e8._8_4_ = (uint)bVar13 * auVar56._8_4_ | (uint)!bVar13 * auVar46._8_4_;
          bVar13 = (bool)((byte)(uVar26 >> 3) & 1);
          local_24e8._12_4_ = (uint)bVar13 * auVar56._12_4_ | (uint)!bVar13 * auVar46._12_4_;
          bVar13 = (bool)((byte)uVar35 & 1);
          local_24d8._0_4_ = (uint)bVar13 * auVar57._0_4_ | (uint)!bVar13 * auVar47._0_4_;
          bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
          local_24d8._4_4_ = (uint)bVar13 * auVar57._4_4_ | (uint)!bVar13 * auVar47._4_4_;
          bVar13 = (bool)((byte)(uVar35 >> 2) & 1);
          local_24d8._8_4_ = (uint)bVar13 * auVar57._8_4_ | (uint)!bVar13 * auVar47._8_4_;
          bVar13 = (bool)((byte)(uVar35 >> 3) & 1);
          local_24d8._12_4_ = (uint)bVar13 * auVar57._12_4_ | (uint)!bVar13 * auVar47._12_4_;
          bVar13 = (bool)((byte)uVar30 & 1);
          local_24c8[0] = (float)((uint)bVar13 * auVar36._0_4_ | (uint)!bVar13 * auVar37._0_4_);
          bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
          local_24c8[1] = (float)((uint)bVar13 * auVar36._4_4_ | (uint)!bVar13 * auVar37._4_4_);
          bVar13 = (bool)((byte)(uVar30 >> 2) & 1);
          local_24c8[2] = (float)((uint)bVar13 * auVar36._8_4_ | (uint)!bVar13 * auVar37._8_4_);
          bVar13 = (bool)((byte)(uVar30 >> 3) & 1);
          local_24c8[3] = (float)((uint)bVar13 * auVar36._12_4_ | (uint)!bVar13 * auVar37._12_4_);
          auVar37._0_4_ = fVar2 * local_24c8[0];
          auVar37._4_4_ = fVar2 * local_24c8[1];
          auVar37._8_4_ = fVar2 * local_24c8[2];
          auVar37._12_4_ = fVar2 * local_24c8[3];
          auVar56 = vfmadd213ps_fma(auVar79,local_24d8,auVar37);
          auVar56 = vfmadd213ps_fma(auVar77,local_24e8,auVar56);
          auVar42._0_4_ = auVar56._0_4_ + auVar56._0_4_;
          auVar42._4_4_ = auVar56._4_4_ + auVar56._4_4_;
          auVar42._8_4_ = auVar56._8_4_ + auVar56._8_4_;
          auVar42._12_4_ = auVar56._12_4_ + auVar56._12_4_;
          auVar36._0_4_ = auVar39._0_4_ * local_24c8[0];
          auVar36._4_4_ = auVar39._4_4_ * local_24c8[1];
          auVar36._8_4_ = auVar39._8_4_ * local_24c8[2];
          auVar36._12_4_ = auVar39._12_4_ * local_24c8[3];
          auVar56 = vfmadd213ps_fma(auVar38,local_24d8,auVar36);
          auVar56 = vfmadd213ps_fma(auVar58,local_24e8,auVar56);
          auVar57 = vrcp14ps_avx512vl(auVar42);
          auVar58._8_4_ = 0x3f800000;
          auVar58._0_8_ = &DAT_3f8000003f800000;
          auVar58._12_4_ = 0x3f800000;
          auVar58 = vfnmadd213ps_avx512vl(auVar57,auVar42,auVar58);
          auVar58 = vfmadd132ps_fma(auVar58,auVar57,auVar57);
          local_24f8._0_4_ = auVar58._0_4_ * (auVar56._0_4_ + auVar56._0_4_);
          local_24f8._4_4_ = auVar58._4_4_ * (auVar56._4_4_ + auVar56._4_4_);
          local_24f8._8_4_ = auVar58._8_4_ * (auVar56._8_4_ + auVar56._8_4_);
          local_24f8._12_4_ = auVar58._12_4_ * (auVar56._12_4_ + auVar56._12_4_);
          auVar80 = ZEXT1664(local_24f8);
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar56._4_4_ = uVar5;
          auVar56._0_4_ = uVar5;
          auVar56._8_4_ = uVar5;
          auVar56._12_4_ = uVar5;
          uVar16 = vcmpps_avx512vl(local_24f8,auVar56,2);
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar57._4_4_ = uVar5;
          auVar57._0_4_ = uVar5;
          auVar57._8_4_ = uVar5;
          auVar57._12_4_ = uVar5;
          uVar15 = vcmpps_avx512vl(local_24f8,auVar57,0xd);
          bVar25 = (byte)uVar16 & (byte)uVar15 & bVar25;
          if (bVar25 != 0) {
            uVar16 = vcmpps_avx512vl(auVar42,_DAT_01feba10,4);
            bVar25 = bVar25 & (byte)uVar16;
            uVar33 = (uint)bVar25;
            if (bVar25 != 0) {
              pSVar8 = context->scene;
              auVar38._8_4_ = 0x219392ef;
              auVar38._0_8_ = 0x219392ef219392ef;
              auVar38._12_4_ = 0x219392ef;
              uVar26 = vcmpps_avx512vl(auVar51,auVar38,5);
              auVar56 = vrcp14ps_avx512vl(auVar43);
              auVar48._8_4_ = 0x3f800000;
              auVar48._0_8_ = &DAT_3f8000003f800000;
              auVar48._12_4_ = 0x3f800000;
              auVar58 = vfnmadd213ps_fma(auVar43,auVar56,auVar48);
              auVar58 = vfmadd132ps_avx512vl(auVar58,auVar56,auVar56);
              fVar2 = (float)((uint)((byte)uVar26 & 1) * auVar58._0_4_);
              fVar3 = (float)((uint)((byte)(uVar26 >> 1) & 1) * auVar58._4_4_);
              fVar4 = (float)((uint)((byte)(uVar26 >> 2) & 1) * auVar58._8_4_);
              fVar1 = (float)((uint)((byte)(uVar26 >> 3) & 1) * auVar58._12_4_);
              auVar40._0_4_ = fVar2 * auVar52._0_4_;
              auVar40._4_4_ = fVar3 * auVar52._4_4_;
              auVar40._8_4_ = fVar4 * auVar52._8_4_;
              auVar40._12_4_ = fVar1 * auVar52._12_4_;
              local_2518 = vminps_avx(auVar40,auVar48);
              auVar47._0_4_ = fVar2 * auVar53._0_4_;
              auVar47._4_4_ = fVar3 * auVar53._4_4_;
              auVar47._8_4_ = fVar4 * auVar53._8_4_;
              auVar47._12_4_ = fVar1 * auVar53._12_4_;
              local_2508 = vminps_avx(auVar47,auVar48);
              lVar32 = lVar32 + uVar34;
              auVar58 = vblendmps_avx512vl(auVar54,local_24f8);
              auVar39._0_4_ =
                   (uint)(bVar25 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar25 & 1) * local_2508._0_4_
              ;
              bVar13 = (bool)(bVar25 >> 1 & 1);
              auVar39._4_4_ = (uint)bVar13 * auVar58._4_4_ | (uint)!bVar13 * local_2508._4_4_;
              bVar13 = (bool)(bVar25 >> 2 & 1);
              auVar39._8_4_ = (uint)bVar13 * auVar58._8_4_ | (uint)!bVar13 * local_2508._8_4_;
              auVar39._12_4_ =
                   (uint)(bVar25 >> 3) * auVar58._12_4_ |
                   (uint)!(bool)(bVar25 >> 3) * local_2508._12_4_;
              auVar58 = vshufps_avx(auVar39,auVar39,0xb1);
              auVar58 = vminps_avx(auVar58,auVar39);
              auVar56 = vshufpd_avx(auVar58,auVar58,1);
              auVar58 = vminps_avx(auVar56,auVar58);
              uVar16 = vcmpps_avx512vl(auVar39,auVar58,0);
              bVar24 = (byte)uVar16 & bVar25;
              if (((byte)uVar16 & bVar25) == 0) {
                bVar24 = bVar25;
              }
              uVar26 = 0;
              for (uVar35 = (ulong)bVar24; (uVar35 & 1) == 0;
                  uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                uVar26 = uVar26 + 1;
              }
              do {
                uVar7 = *(uint *)(lVar32 + 0x120 + uVar26 * 4);
                pGVar9 = (pSVar8->geometries).items[uVar7].ptr;
                auVar58 = auVar39;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar25 = ~(byte)(1 << ((uint)uVar26 & 0x1f)) & (byte)uVar33;
LAB_00841688:
                  uVar33 = (uint)bVar25;
                  bVar13 = true;
                }
                else {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    uVar5 = *(undefined4 *)(local_2518 + uVar26 * 4);
                    local_2478._4_4_ = uVar5;
                    local_2478._0_4_ = uVar5;
                    local_2478._8_4_ = uVar5;
                    local_2478._12_4_ = uVar5;
                    local_2468 = *(undefined4 *)(local_2508 + uVar26 * 4);
                    local_2448 = vpbroadcastd_avx512vl();
                    uVar5 = *(undefined4 *)(lVar32 + 0x130 + uVar26 * 4);
                    local_2458._4_4_ = uVar5;
                    local_2458._0_4_ = uVar5;
                    local_2458._8_4_ = uVar5;
                    local_2458._12_4_ = uVar5;
                    uVar5 = *(undefined4 *)(local_24e8 + uVar26 * 4);
                    fVar2 = local_24c8[uVar26 - 4];
                    local_2498._4_4_ = fVar2;
                    local_2498._0_4_ = fVar2;
                    local_2498._8_4_ = fVar2;
                    local_2498._12_4_ = fVar2;
                    fVar2 = local_24c8[uVar26];
                    local_2488._4_4_ = fVar2;
                    local_2488._0_4_ = fVar2;
                    local_2488._8_4_ = fVar2;
                    local_2488._12_4_ = fVar2;
                    local_24a8[0] = (RTCHitN)(char)uVar5;
                    local_24a8[1] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_24a8[2] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_24a8[3] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    local_24a8[4] = (RTCHitN)(char)uVar5;
                    local_24a8[5] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_24a8[6] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_24a8[7] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    local_24a8[8] = (RTCHitN)(char)uVar5;
                    local_24a8[9] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_24a8[10] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_24a8[0xb] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    local_24a8[0xc] = (RTCHitN)(char)uVar5;
                    local_24a8[0xd] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_24a8[0xe] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_24a8[0xf] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    uStack_2464 = local_2468;
                    uStack_2460 = local_2468;
                    uStack_245c = local_2468;
                    vpcmpeqd_avx2(ZEXT1632(local_2478),ZEXT1632(local_2478));
                    uStack_2434 = context->user->instID[0];
                    local_2438 = uStack_2434;
                    uStack_2430 = uStack_2434;
                    uStack_242c = uStack_2434;
                    uStack_2428 = context->user->instPrimID[0];
                    uStack_2424 = uStack_2428;
                    uStack_2420 = uStack_2428;
                    uStack_241c = uStack_2428;
                    uVar18 = *(uint *)(ray + k * 4 + 0x80);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_24f8 + uVar26 * 4);
                    local_26a8 = local_24b8._0_8_;
                    uStack_26a0 = local_24b8._8_8_;
                    args.valid = (int *)&local_26a8;
                    args.geometryUserPtr = pGVar9->userPtr;
                    args.context = context->user;
                    args.hit = local_24a8;
                    args.N = 4;
                    auVar58 = auVar80._0_16_;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_2698 = pSVar27;
                      (*pGVar9->intersectionFilterN)(&args);
                      auVar80 = ZEXT1664(auVar58);
                      pSVar27 = local_2698;
                    }
                    auVar49._8_8_ = uStack_26a0;
                    auVar49._0_8_ = local_26a8;
                    uVar35 = vptestmd_avx512vl(auVar49,auVar49);
                    if ((uVar35 & 0xf) == 0) {
LAB_008419db:
                      auVar58 = ZEXT416(uVar18);
                      *(uint *)(ray + k * 4 + 0x80) = uVar18;
                    }
                    else {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var10)(&args);
                        auVar80 = ZEXT1664(auVar58);
                      }
                      auVar50._8_8_ = uStack_26a0;
                      auVar50._0_8_ = local_26a8;
                      uVar35 = vptestmd_avx512vl(auVar50,auVar50);
                      uVar35 = uVar35 & 0xf;
                      bVar25 = (byte)uVar35;
                      if (bVar25 == 0) goto LAB_008419db;
                      iVar22 = *(int *)(args.hit + 4);
                      iVar19 = *(int *)(args.hit + 8);
                      iVar20 = *(int *)(args.hit + 0xc);
                      bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar12 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar25 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar13 * iVar22 | (uint)!bVar13 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar12 * iVar20 | (uint)!bVar12 * *(int *)(args.ray + 0xcc);
                      iVar22 = *(int *)(args.hit + 0x14);
                      iVar19 = *(int *)(args.hit + 0x18);
                      iVar20 = *(int *)(args.hit + 0x1c);
                      bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar12 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar25 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar13 * iVar22 | (uint)!bVar13 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar12 * iVar20 | (uint)!bVar12 * *(int *)(args.ray + 0xdc);
                      iVar22 = *(int *)(args.hit + 0x24);
                      iVar19 = *(int *)(args.hit + 0x28);
                      iVar20 = *(int *)(args.hit + 0x2c);
                      bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar12 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar25 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar13 * iVar22 | (uint)!bVar13 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar12 * iVar20 | (uint)!bVar12 * *(int *)(args.ray + 0xec);
                      iVar22 = *(int *)(args.hit + 0x34);
                      iVar19 = *(int *)(args.hit + 0x38);
                      iVar20 = *(int *)(args.hit + 0x3c);
                      bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar12 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar25 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar13 * iVar22 | (uint)!bVar13 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar12 * iVar20 | (uint)!bVar12 * *(int *)(args.ray + 0xfc);
                      iVar22 = *(int *)(args.hit + 0x44);
                      iVar19 = *(int *)(args.hit + 0x48);
                      iVar20 = *(int *)(args.hit + 0x4c);
                      bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar12 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0x100) =
                           (uint)(bVar25 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0x100);
                      *(uint *)(args.ray + 0x104) =
                           (uint)bVar13 * iVar22 | (uint)!bVar13 * *(int *)(args.ray + 0x104);
                      *(uint *)(args.ray + 0x108) =
                           (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0x108);
                      *(uint *)(args.ray + 0x10c) =
                           (uint)bVar12 * iVar20 | (uint)!bVar12 * *(int *)(args.ray + 0x10c);
                      auVar58 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar58;
                      auVar58 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar58;
                      auVar58 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar58;
                      auVar58 = *(undefined1 (*) [16])(args.hit + 0x80);
                      auVar56 = vmovdqa32_avx512vl(auVar58);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar56;
                    }
                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar74 = ZEXT1664(auVar56);
                    uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
                    auVar52._4_4_ = uVar5;
                    auVar52._0_4_ = uVar5;
                    auVar52._8_4_ = uVar5;
                    auVar52._12_4_ = uVar5;
                    uVar16 = vcmpps_avx512vl(auVar80._0_16_,auVar52,2);
                    bVar25 = ~(byte)(1 << ((uint)uVar26 & 0x1f)) & (byte)uVar33 & (byte)uVar16;
                    goto LAB_00841688;
                  }
                  bVar13 = false;
                }
                if (!bVar13) {
                  uVar5 = *(undefined4 *)(local_2518 + uVar26 * 4);
                  uVar6 = *(undefined4 *)(local_2508 + uVar26 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_24f8 + uVar26 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_24e8 + uVar26 * 4);
                  *(float *)(ray + k * 4 + 0xd0) = local_24c8[uVar26 - 4];
                  *(float *)(ray + k * 4 + 0xe0) = local_24c8[uVar26];
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar5;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar6;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)(lVar32 + 0x130 + uVar26 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar7;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                bVar25 = (byte)uVar33;
                if (bVar25 == 0) break;
                auVar56 = vblendmps_avx512vl(auVar74._0_16_,auVar80._0_16_);
                auVar39._0_4_ =
                     (uint)(bVar25 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar25 & 1) * auVar58._0_4_;
                bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar39._4_4_ = (uint)bVar13 * auVar56._4_4_ | (uint)!bVar13 * auVar58._4_4_;
                bVar13 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar39._8_4_ = (uint)bVar13 * auVar56._8_4_ | (uint)!bVar13 * auVar58._8_4_;
                auVar39._12_4_ =
                     (uVar33 >> 3) * auVar56._12_4_ | (uint)!SUB41(uVar33 >> 3,0) * auVar58._12_4_;
                auVar58 = vshufps_avx(auVar39,auVar39,0xb1);
                auVar58 = vminps_avx(auVar58,auVar39);
                auVar56 = vshufpd_avx(auVar58,auVar58,1);
                auVar58 = vminps_avx(auVar56,auVar58);
                uVar16 = vcmpps_avx512vl(auVar39,auVar58,0);
                bVar25 = (byte)uVar16 & bVar25;
                uVar7 = uVar33;
                if (bVar25 != 0) {
                  uVar7 = (uint)bVar25;
                }
                uVar18 = 0;
                for (; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x80000000) {
                  uVar18 = uVar18 + 1;
                }
                uVar26 = (ulong)uVar18;
              } while( true );
            }
          }
        }
        local_2660 = local_2660 + 1;
      } while (local_2660 != local_2668);
    }
    uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar74 = ZEXT3264(CONCAT428(uVar5,CONCAT424(uVar5,CONCAT420(uVar5,CONCAT416(uVar5,CONCAT412(
                                                  uVar5,CONCAT48(uVar5,CONCAT44(uVar5,uVar5))))))));
    auVar80 = ZEXT3264(local_23b8);
    auVar81 = ZEXT3264(local_23d8);
    auVar83 = ZEXT3264(local_23f8);
    auVar84 = ZEXT3264(local_2418);
    auVar70 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar85 = ZEXT3264(auVar70);
    auVar87 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    in_ZMM15 = ZEXT3264(local_2398);
    uVar26 = local_2678;
    unaff_RBP = local_2670;
    uVar35 = local_2690;
    uVar30 = local_2680;
    uVar31 = local_2688;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }